

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void prf_state_pop(prf_state_t *state)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = state->state_push_level;
  if (state->inv_dirty == 0) {
    if (1 < uVar1) {
      iVar2 = bcmp(state->matrix[uVar1 - 1],state->matrix[uVar1],0x40);
      if (iVar2 == 0) goto LAB_00104a38;
    }
    state->inv_dirty = 1;
  }
LAB_00104a38:
  state->state_push_level = uVar1 - 1;
  prf_debug(1,"state popped to level %d",(ulong)(ushort)(uVar1 - 1));
  return;
}

Assistant:

void
prf_state_pop(
    prf_state_t * state )
{
    assert( state != NULL );

    if ( state->inv_dirty == FALSE) {
        if ( state->state_push_level > 1 ) {
            matrix4x4_f32_t * m1, * m2;
            m1 = state->matrix[state->state_push_level-1];
            m2 = state->matrix[state->state_push_level];
            if ( memcmp( m1, m2, sizeof( matrix4x4_f32_t ) ) != 0 )
                state->inv_dirty = TRUE;
        } else {
            state->inv_dirty = TRUE;
        }
    }
    state->state_push_level--;
    prf_debug( 1, "state popped to level %d", state->state_push_level );
}